

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__platform_invalidate_fd(uv_loop_t *loop,int fd)

{
  void *pvVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  epoll_event dummy;
  
  pvVar1 = loop->internal_fields;
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x1d8);
  if (puVar2 == (undefined8 *)0x0) {
    dummy.data.u64._4_4_ = 0;
    dummy._0_8_ = 0;
    epoll_ctl(loop->backend_fd,2,fd,(epoll_event *)&dummy);
  }
  else {
    lVar3 = 4;
    for (lVar4 = 0; lVar4 < *(int *)(puVar2 + 2); lVar4 = lVar4 + 1) {
      if (*(int *)(puVar2[1] + lVar3) == fd) {
        *(undefined4 *)(puVar2[1] + lVar3) = 0xffffffff;
      }
      lVar3 = lVar3 + 0xc;
    }
    dummy.data.u64._4_4_ = 0;
    dummy._0_8_ = 0;
    uv__epoll_ctl_prep(loop->backend_fd,(uv__iou *)((long)pvVar1 + 200),
                       (epoll_event (*) [256])*puVar2,2,fd,&dummy);
  }
  return;
}

Assistant:

void uv__platform_invalidate_fd(uv_loop_t* loop, int fd) {
  uv__loop_internal_fields_t* lfields;
  struct uv__invalidate* inv;
  struct epoll_event dummy;
  int i;

  lfields = uv__get_internal_fields(loop);
  inv = lfields->inv;

  /* Invalidate events with same file descriptor */
  if (inv != NULL)
    for (i = 0; i < inv->nfds; i++)
      if (inv->events[i].data.fd == fd)
        inv->events[i].data.fd = -1;

  /* Remove the file descriptor from the epoll.
   * This avoids a problem where the same file description remains open
   * in another process, causing repeated junk epoll events.
   *
   * We pass in a dummy epoll_event, to work around a bug in old kernels.
   *
   * Work around a bug in kernels 3.10 to 3.19 where passing a struct that
   * has the EPOLLWAKEUP flag set generates spurious audit syslog warnings.
   */
  memset(&dummy, 0, sizeof(dummy));

  if (inv == NULL) {
    epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &dummy);
  } else {
    uv__epoll_ctl_prep(loop->backend_fd,
                       &lfields->ctl,
                       inv->prep,
                       EPOLL_CTL_DEL,
                       fd,
                       &dummy);
  }
}